

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_gramma_analysis.cpp
# Opt level: O3

compile_errcode __thiscall ArgumentList::Parse(ArgumentList *this)

{
  LogTools *log_tools_ptr;
  SymbolName SVar1;
  undefined4 uVar2;
  string local_40;
  
  uVar2 = 0;
  do {
    SVar1 = SymbolQueue::GetCurrentName(handle_symbol_queue);
    log_tools_ptr = g_log_tools;
    switch(uVar2) {
    case 0:
      if (SVar1 == R_CIRCLE_BRACKET_SYM) {
        return 0;
      }
      uVar2 = 1;
      if ((SVar1 & ~SWITCH_SYM) != INT_SYM) {
        local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_40,"expected a \')\' in argument list","");
        GrammaErrorLogs(log_tools_ptr,&local_40);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_40._M_dataplus._M_p != &local_40.field_2) {
          operator_delete(local_40._M_dataplus._M_p);
        }
        return -1;
      }
      break;
    case 1:
      uVar2 = 2;
      if (SVar1 != IDENTIFIER_SYM) {
        return -1;
      }
      break;
    case 2:
      uVar2 = 3;
      if (SVar1 != COMMA_SYM) {
        return 0;
      }
      break;
    case 3:
      uVar2 = 1;
      if ((SVar1 & ~SWITCH_SYM) != INT_SYM) {
        return -1;
      }
    }
    SymbolQueue::NextSymbol(handle_symbol_queue);
  } while( true );
}

Assistant:

compile_errcode ArgumentList::Parse() {
    int ret = COMPILE_OK;
    int state = 0;
    while (true) {
        SymbolName name = handle_symbol_queue->GetCurrentName();
        switch (state) {
            case 0: {
                if (name == R_CIRCLE_BRACKET_SYM) {
                    return COMPILE_OK;
                } else if (IsValidVariableType(name)) {
                    state = 1;
                    break;
                } else {
                    GrammaErrorLogs(g_log_tools, "expected a ')' in argument list");
                    return NOT_MATCH;
                }
            }
            case 1: {
                if (name == IDENTIFIER_SYM) {
                    state = 2;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 2: {
                if (name == COMMA_SYM) {
                    state = 3;
                    break;
                } else {
                    return COMPILE_OK;
                }
            }
            case 3: {
                if (IsValidVariableType(name)) {
                    state = 1;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
        }
        handle_symbol_queue->NextSymbol();
    }
}